

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O2

void __thiscall
adios2::core::Stream::Stream
          (Stream *this,string *name,Mode mode,string *engineType,string *hostLanguage)

{
  Comm local_70;
  string local_68;
  string local_48;
  
  helper::CommDummy();
  std::__cxx11::string::string((string *)&local_48,(string *)engineType);
  std::__cxx11::string::string((string *)&local_68,(string *)hostLanguage);
  Stream(this,name,mode,&local_70,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  helper::Comm::~Comm(&local_70);
  return;
}

Assistant:

Stream::Stream(const std::string &name, const Mode mode, const std::string engineType,
               const std::string hostLanguage)
: Stream(name, mode, helper::CommDummy(), engineType, hostLanguage)
{
}